

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eckey_impl.h
# Opt level: O1

int secp256k1_eckey_pubkey_serialize(secp256k1_ge *elem,uchar *pub,size_t *size,int compressed)

{
  secp256k1_fe *r;
  uint64_t uVar1;
  ulong uVar2;
  int iVar3;
  undefined8 extraout_RDX;
  ulong heap_size;
  secp256k1_ge *arr;
  secp256k1_context *ctx;
  _func_int_void_ptr_void_ptr_void_ptr *in_R8;
  void *in_R9;
  long lVar4;
  ulong i;
  byte *output;
  size_t sStack_a8;
  secp256k1_ge *apsStack_a0 [2];
  byte abStack_90 [33];
  byte abStack_6f [39];
  uchar *puStack_48;
  secp256k1_fe *psStack_40;
  secp256k1_ge *psStack_38;
  code *pcStack_30;
  
  pcStack_30 = (code *)0x107971;
  secp256k1_ge_verify(elem);
  iVar3 = 0;
  if (elem->infinity == 0) {
    pcStack_30 = (code *)0x107982;
    secp256k1_fe_normalize_var(&elem->x);
    r = &elem->y;
    pcStack_30 = (code *)0x10798e;
    secp256k1_fe_normalize_var(r);
    pcStack_30 = (code *)0x10799a;
    arr = elem;
    secp256k1_fe_get_b32(pub + 1,&elem->x);
    if (compressed == 0) {
      *size = 0x41;
      *pub = '\x04';
      pcStack_30 = (code *)0x1079d9;
      secp256k1_fe_get_b32(pub + 0x21,r);
    }
    else {
      *size = 0x21;
      pcStack_30 = (code *)0x1079ad;
      ctx = (secp256k1_context *)r;
      secp256k1_fe_verify(r);
      if ((elem->y).normalized == 0) {
        pcStack_30 = secp256k1_ec_pubkey_cmp;
        secp256k1_eckey_pubkey_serialize_cold_1();
        puStack_48 = pub;
        psStack_40 = r;
        psStack_38 = elem;
        pcStack_30 = (code *)size;
        if (ctx != (secp256k1_context *)0x0) {
          apsStack_a0[0] = arr;
          apsStack_a0[1] = (secp256k1_ge *)extraout_RDX;
          output = abStack_90;
          lVar4 = 0;
          do {
            sStack_a8 = 0x21;
            iVar3 = secp256k1_ec_pubkey_serialize
                              (ctx,output,&sStack_a8,(secp256k1_pubkey *)apsStack_a0[lVar4],0x102);
            if (iVar3 == 0) {
              output[0x10] = 0;
              output[0x11] = 0;
              output[0x12] = 0;
              output[0x13] = 0;
              output[0x14] = 0;
              output[0x15] = 0;
              output[0x16] = 0;
              output[0x17] = 0;
              output[0x18] = 0;
              output[0x19] = 0;
              output[0x1a] = 0;
              output[0x1b] = 0;
              output[0x1c] = 0;
              output[0x1d] = 0;
              output[0x1e] = 0;
              output[0x1f] = 0;
              output[0] = 0;
              output[1] = 0;
              output[2] = 0;
              output[3] = 0;
              output[4] = 0;
              output[5] = 0;
              output[6] = 0;
              output[7] = 0;
              output[8] = 0;
              output[9] = 0;
              output[10] = 0;
              output[0xb] = 0;
              output[0xc] = 0;
              output[0xd] = 0;
              output[0xe] = 0;
              output[0xf] = 0;
              output[0x20] = 0;
            }
            lVar4 = lVar4 + 1;
            output = output + 0x21;
          } while (lVar4 == 1);
          lVar4 = 0;
          do {
            if (abStack_90[lVar4] != abStack_6f[lVar4]) {
              return (uint)abStack_90[lVar4] - (uint)abStack_6f[lVar4];
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 != 0x21);
          return 0;
        }
        secp256k1_ec_pubkey_cmp_cold_1();
        if (ctx == (secp256k1_context *)0x0) {
          secp256k1_ec_pubkey_sort_cold_2();
        }
        else if (arr != (secp256k1_ge *)0x0) {
          uVar2 = heap_size;
          if (1 < heap_size) {
            i = heap_size >> 1;
            do {
              i = i - 1;
              secp256k1_heap_down((uchar *)arr,i,heap_size,(size_t)ctx,in_R8,in_R9);
            } while (i != 0);
          }
          while (1 < uVar2) {
            uVar1 = (arr->x).n[0];
            (arr->x).n[0] = (arr->x).n[uVar2 - 1];
            (arr->x).n[uVar2 - 1] = uVar1;
            secp256k1_heap_down((uchar *)arr,0,uVar2 - 1,(size_t)ctx,in_R8,in_R9);
            uVar2 = uVar2 - 1;
          }
          return 1;
        }
        secp256k1_ec_pubkey_sort_cold_1();
        return 0;
      }
      *pub = (byte)r->n[0] & 1 | 2;
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int secp256k1_eckey_pubkey_serialize(secp256k1_ge *elem, unsigned char *pub, size_t *size, int compressed) {
    if (secp256k1_ge_is_infinity(elem)) {
        return 0;
    }
    secp256k1_fe_normalize_var(&elem->x);
    secp256k1_fe_normalize_var(&elem->y);
    secp256k1_fe_get_b32(&pub[1], &elem->x);
    if (compressed) {
        *size = 33;
        pub[0] = secp256k1_fe_is_odd(&elem->y) ? SECP256K1_TAG_PUBKEY_ODD : SECP256K1_TAG_PUBKEY_EVEN;
    } else {
        *size = 65;
        pub[0] = SECP256K1_TAG_PUBKEY_UNCOMPRESSED;
        secp256k1_fe_get_b32(&pub[33], &elem->y);
    }
    return 1;
}